

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

ProString * __thiscall
QHash<ProKey,_ProString>::value
          (ProString *__return_storage_ptr__,QHash<ProKey,_ProString> *this,ProKey *key)

{
  Node<ProKey,_ProString> *pNVar1;
  
  if ((this->d != (Data<QHashPrivate::Node<ProKey,_ProString>_> *)0x0) &&
     (pNVar1 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::findNode<ProKey>
                         (this->d,key), pNVar1 != (Node<ProKey,_ProString> *)0x0)) {
    ProString::ProString(__return_storage_ptr__,&pNVar1->value);
    return __return_storage_ptr__;
  }
  ProString::ProString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }